

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall llvm::ItaniumPartialDemangler::isCtorOrDtor(ItaniumPartialDemangler *this)

{
  Kind KVar1;
  FunctionEncoding *local_20;
  Node *N;
  ItaniumPartialDemangler *this_local;
  
  local_20 = (FunctionEncoding *)this->RootNode;
  while (local_20 != (FunctionEncoding *)0x0) {
    KVar1 = anon_unknown.dwarf_426d84::Node::getKind(&local_20->super_Node);
    switch(KVar1) {
    case KAbiTagAttr:
      local_20 = (FunctionEncoding *)local_20->Ret;
      break;
    default:
      return false;
    case KFunctionEncoding:
      local_20 = (FunctionEncoding *)anon_unknown.dwarf_426d84::FunctionEncoding::getName(local_20);
      break;
    case KNestedName:
      local_20 = (FunctionEncoding *)local_20->Name;
      break;
    case KLocalName:
      local_20 = (FunctionEncoding *)local_20->Name;
      break;
    case KNameWithTemplateArgs:
      local_20 = (FunctionEncoding *)local_20->Ret;
      break;
    case KStdQualifiedName:
      local_20 = (FunctionEncoding *)local_20->Ret;
      break;
    case KCtorDtorName:
      return true;
    }
  }
  return false;
}

Assistant:

bool ItaniumPartialDemangler::isCtorOrDtor() const {
  Node *N = static_cast<Node *>(RootNode);
  while (N) {
    switch (N->getKind()) {
    default:
      return false;
    case Node::KCtorDtorName:
      return true;

    case Node::KAbiTagAttr:
      N = static_cast<AbiTagAttr *>(N)->Base;
      break;
    case Node::KFunctionEncoding:
      N = static_cast<FunctionEncoding *>(N)->getName();
      break;
    case Node::KLocalName:
      N = static_cast<LocalName *>(N)->Entity;
      break;
    case Node::KNameWithTemplateArgs:
      N = static_cast<NameWithTemplateArgs *>(N)->Name;
      break;
    case Node::KNestedName:
      N = static_cast<NestedName *>(N)->Name;
      break;
    case Node::KStdQualifiedName:
      N = static_cast<StdQualifiedName *>(N)->Child;
      break;
    }
  }
  return false;
}